

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::reduceDB_Tier2(Solver *this)

{
  reduceDB_tch lt;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  Clause *this_00;
  float *pfVar5;
  uint32_t *puVar6;
  uint *puVar7;
  Solver *in_RDI;
  Clause *c;
  int limit;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff98;
  Ref in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  vec<unsigned_int> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ClauseAllocator *c_00;
  undefined4 in_stack_ffffffffffffffc0;
  vec<unsigned_int> *c_01;
  int local_1c;
  reduceDB_tch local_18;
  int local_10;
  int local_c;
  
  reset_old_trail((Solver *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  c_01 = &in_RDI->learnts_tier2;
  reduceDB_tch::reduceDB_tch(&local_18,&in_RDI->ca);
  lt.ca._4_4_ = in_stack_ffffffffffffffb4;
  lt.ca._0_4_ = in_stack_ffffffffffffffb0;
  sort<unsigned_int,reduceDB_tch>(in_stack_ffffffffffffffa8,lt);
  local_1c = vec<unsigned_int>::size(&in_RDI->learnts_tier2);
  local_1c = local_1c / 2;
  local_10 = 0;
  local_c = 0;
  while (iVar4 = local_c, iVar2 = vec<unsigned_int>::size(&in_RDI->learnts_tier2), iVar4 < iVar2) {
    c_00 = &in_RDI->ca;
    vec<unsigned_int>::operator[](&in_RDI->learnts_tier2,local_c);
    this_00 = ClauseAllocator::operator[]
                        ((ClauseAllocator *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
    uVar3 = Clause::mark(this_00);
    if (uVar3 == 2) {
      bVar1 = locked(in_RDI,(Clause *)c_01);
      if ((bVar1) || (local_1c <= local_c)) {
        puVar7 = vec<unsigned_int>::operator[](&in_RDI->learnts_tier2,local_c);
        iVar4 = local_10;
        in_stack_ffffffffffffffa4 = *puVar7;
        local_10 = local_10 + 1;
        puVar7 = vec<unsigned_int>::operator[](&in_RDI->learnts_tier2,iVar4);
        *puVar7 = in_stack_ffffffffffffffa4;
        bVar1 = locked(in_RDI,(Clause *)c_01);
        if (bVar1) {
          local_1c = local_1c + 1;
        }
      }
      else {
        vec<unsigned_int>::operator[](&in_RDI->learnts_tier2,local_c);
        vec<unsigned_int>::push
                  ((vec<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (uint *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        Clause::mark(this_00,0);
        pfVar5 = Clause::activity(this_00);
        *pfVar5 = 0.0;
        uVar3 = (uint32_t)in_RDI->conflicts;
        puVar6 = Clause::touched(this_00);
        *puVar6 = uVar3;
        claBumpActivity((Solver *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),(Clause *)c_00);
      }
    }
    local_c = local_c + 1;
  }
  vec<unsigned_int>::shrink(&in_RDI->learnts_tier2,local_c - local_10);
  iVar4 = vec<unsigned_int>::size(&in_RDI->learnts_tier2);
  (in_RDI->statistics).solveSteps = (long)iVar4 + (in_RDI->statistics).solveSteps;
  return;
}

Assistant:

void Solver::reduceDB_Tier2()
{
    TRACE(std::cout << "c run reduceDB_tier2 on level " << decisionLevel() << std::endl);
    reset_old_trail();
    int i, j;
    sort(learnts_tier2, reduceDB_tch(ca));
    int limit = learnts_tier2.size() / 2;

    for (i = j = 0; i < learnts_tier2.size(); i++) {
        Clause &c = ca[learnts_tier2[i]];
        if (c.mark() == TIER2) {
            if (!locked(c) && i < limit) {
                learnts_local.push(learnts_tier2[i]);
                c.mark(LOCAL);
                // c.removable(true);
                c.activity() = 0;
                c.touched() = conflicts;
                claBumpActivity(c);
            } else {
                learnts_tier2[j++] = learnts_tier2[i];
                if (locked(c)) {
                    limit++;
                }
            }
        }
    }
    learnts_tier2.shrink(i - j);
    statistics.solveSteps += learnts_tier2.size();
    TRACE(std::cout << "c done running reduceDB_tier2 on level " << decisionLevel() << std::endl);
}